

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

S2Cap * __thiscall
S2MinDistanceEdgeTarget::GetCapBound(S2Cap *__return_storage_ptr__,S2MinDistanceEdgeTarget *this)

{
  double dVar1;
  double dVar2;
  S1ChordAngle radius;
  D local_60;
  D local_48;
  double local_30;
  double r2;
  double local_20;
  double d2;
  S2MinDistanceEdgeTarget *this_local;
  
  d2 = (double)this;
  this_local = (S2MinDistanceEdgeTarget *)__return_storage_ptr__;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&r2,&this->a_,&this->b_);
  local_20 = S1ChordAngle::length2((S1ChordAngle *)&r2);
  dVar1 = local_20 * 0.5;
  dVar2 = sqrt(1.0 - local_20 * 0.25);
  local_30 = dVar1 / (dVar2 + 1.0);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            (&local_60,(BasicVector<Vector3,_double,_3UL> *)&this->a_,&this->b_);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (&local_48,(BasicVector<Vector3,_double,_3UL> *)&local_60);
  radius = S1ChordAngle::FromLength2(local_30);
  S2Cap::S2Cap(__return_storage_ptr__,&local_48,radius);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MinDistanceEdgeTarget::GetCapBound() {
  // The following computes a radius equal to half the edge length in an
  // efficient and numerically stable way.
  double d2 = S1ChordAngle(a_, b_).length2();
  double r2 = (0.5 * d2) / (1 + sqrt(1 - 0.25 * d2));
  return S2Cap((a_ + b_).Normalize(), S1ChordAngle::FromLength2(r2));
}